

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int amqpvalue_get_flow(AMQP_VALUE value,FLOW_HANDLE *flow_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  int iVar3;
  FLOW_HANDLE pFVar4;
  AMQP_VALUE pAVar5;
  AMQP_VALUE pAVar6;
  uint32_t list_item_count;
  transfer_number next_incoming_id;
  
  pFVar4 = (FLOW_HANDLE)malloc(8);
  if (pFVar4 == (FLOW_HANDLE)0x0) {
    *flow_handle = (FLOW_HANDLE)0x0;
    iVar3 = 0x1561;
  }
  else {
    pFVar4->composite_value = (AMQP_VALUE)0x0;
    *flow_handle = pFVar4;
    pAVar5 = amqpvalue_get_inplace_described_value(value);
    if (pAVar5 == (AMQP_VALUE)0x0) {
      flow_destroy(*flow_handle);
      iVar3 = 0x1569;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAVar5,&list_item_count);
      iVar3 = 0x1570;
      if ((iVar1 == 0) && (iVar3 = 0x15ba, list_item_count != 0)) {
        pAVar6 = amqpvalue_get_list_item(pAVar5,0);
        if (pAVar6 != (AMQP_VALUE)0x0) {
          AVar2 = amqpvalue_get_type(pAVar6);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar1 = amqpvalue_get_uint(pAVar6,&next_incoming_id), iVar1 != 0)) {
            amqpvalue_destroy(pAVar6);
            flow_destroy(*flow_handle);
            return 0x158c;
          }
          amqpvalue_destroy(pAVar6);
        }
        if (1 < list_item_count) {
          pAVar6 = amqpvalue_get_list_item(pAVar5,1);
          if (pAVar6 == (AMQP_VALUE)0x0) {
            flow_destroy(*flow_handle);
            iVar3 = 0x159c;
          }
          else {
            AVar2 = amqpvalue_get_type(pAVar6);
            if (AVar2 == AMQP_TYPE_NULL) {
              amqpvalue_destroy(pAVar6);
              flow_destroy(*flow_handle);
              iVar3 = 0x15a6;
            }
            else {
              iVar3 = amqpvalue_get_uint(pAVar6,&next_incoming_id);
              if (iVar3 == 0) {
                amqpvalue_destroy(pAVar6);
                iVar3 = 0x15e3;
                if (2 < list_item_count) {
                  pAVar6 = amqpvalue_get_list_item(pAVar5,2);
                  if (pAVar6 == (AMQP_VALUE)0x0) {
                    flow_destroy(*flow_handle);
                    iVar3 = 0x15c5;
                  }
                  else {
                    AVar2 = amqpvalue_get_type(pAVar6);
                    if (AVar2 == AMQP_TYPE_NULL) {
                      amqpvalue_destroy(pAVar6);
                      flow_destroy(*flow_handle);
                      iVar3 = 0x15cf;
                    }
                    else {
                      iVar3 = amqpvalue_get_uint(pAVar6,&next_incoming_id);
                      if (iVar3 == 0) {
                        amqpvalue_destroy(pAVar6);
                        iVar3 = 0x160c;
                        if (3 < list_item_count) {
                          pAVar6 = amqpvalue_get_list_item(pAVar5,3);
                          if (pAVar6 == (AMQP_VALUE)0x0) {
                            flow_destroy(*flow_handle);
                            iVar3 = 0x15ee;
                          }
                          else {
                            AVar2 = amqpvalue_get_type(pAVar6);
                            if (AVar2 == AMQP_TYPE_NULL) {
                              amqpvalue_destroy(pAVar6);
                              flow_destroy(*flow_handle);
                              iVar3 = 0x15f8;
                            }
                            else {
                              iVar3 = amqpvalue_get_uint(pAVar6,&next_incoming_id);
                              if (iVar3 == 0) {
                                amqpvalue_destroy(pAVar6);
                                if (4 < list_item_count) {
                                  pAVar6 = amqpvalue_get_list_item(pAVar5,4);
                                  if (pAVar6 != (AMQP_VALUE)0x0) {
                                    AVar2 = amqpvalue_get_type(pAVar6);
                                    if ((AVar2 != AMQP_TYPE_NULL) &&
                                       (iVar3 = amqpvalue_get_uint(pAVar6,&next_incoming_id),
                                       iVar3 != 0)) {
                                      amqpvalue_destroy(pAVar6);
                                      flow_destroy(*flow_handle);
                                      return 0x1624;
                                    }
                                    amqpvalue_destroy(pAVar6);
                                  }
                                  if (5 < list_item_count) {
                                    pAVar6 = amqpvalue_get_list_item(pAVar5,5);
                                    if (pAVar6 != (AMQP_VALUE)0x0) {
                                      AVar2 = amqpvalue_get_type(pAVar6);
                                      if ((AVar2 != AMQP_TYPE_NULL) &&
                                         (iVar3 = amqpvalue_get_uint(pAVar6,&next_incoming_id),
                                         iVar3 != 0)) {
                                        amqpvalue_destroy(pAVar6);
                                        flow_destroy(*flow_handle);
                                        return 0x1641;
                                      }
                                      amqpvalue_destroy(pAVar6);
                                    }
                                    if (6 < list_item_count) {
                                      pAVar6 = amqpvalue_get_list_item(pAVar5,6);
                                      if (pAVar6 != (AMQP_VALUE)0x0) {
                                        AVar2 = amqpvalue_get_type(pAVar6);
                                        if ((AVar2 != AMQP_TYPE_NULL) &&
                                           (iVar3 = amqpvalue_get_uint(pAVar6,&next_incoming_id),
                                           iVar3 != 0)) {
                                          amqpvalue_destroy(pAVar6);
                                          flow_destroy(*flow_handle);
                                          return 0x165e;
                                        }
                                        amqpvalue_destroy(pAVar6);
                                      }
                                      if (7 < list_item_count) {
                                        pAVar6 = amqpvalue_get_list_item(pAVar5,7);
                                        if (pAVar6 != (AMQP_VALUE)0x0) {
                                          AVar2 = amqpvalue_get_type(pAVar6);
                                          if ((AVar2 != AMQP_TYPE_NULL) &&
                                             (iVar3 = amqpvalue_get_uint(pAVar6,&next_incoming_id),
                                             iVar3 != 0)) {
                                            amqpvalue_destroy(pAVar6);
                                            flow_destroy(*flow_handle);
                                            return 0x167b;
                                          }
                                          amqpvalue_destroy(pAVar6);
                                        }
                                        if (8 < list_item_count) {
                                          pAVar6 = amqpvalue_get_list_item(pAVar5,8);
                                          if (pAVar6 != (AMQP_VALUE)0x0) {
                                            AVar2 = amqpvalue_get_type(pAVar6);
                                            if ((AVar2 != AMQP_TYPE_NULL) &&
                                               (iVar3 = amqpvalue_get_boolean
                                                                  (pAVar6,(_Bool *)&next_incoming_id
                                                                  ), iVar3 != 0)) {
                                              amqpvalue_destroy(pAVar6);
                                              flow_destroy(*flow_handle);
                                              return 0x1698;
                                            }
                                            amqpvalue_destroy(pAVar6);
                                          }
                                          if (9 < list_item_count) {
                                            pAVar6 = amqpvalue_get_list_item(pAVar5,9);
                                            if (pAVar6 != (AMQP_VALUE)0x0) {
                                              AVar2 = amqpvalue_get_type(pAVar6);
                                              if ((AVar2 != AMQP_TYPE_NULL) &&
                                                 (iVar3 = amqpvalue_get_boolean
                                                                    (pAVar6,(_Bool *)&
                                                  next_incoming_id), iVar3 != 0)) {
                                                amqpvalue_destroy(pAVar6);
                                                flow_destroy(*flow_handle);
                                                return 0x16b5;
                                              }
                                              amqpvalue_destroy(pAVar6);
                                            }
                                            if ((10 < list_item_count) &&
                                               (pAVar5 = amqpvalue_get_list_item(pAVar5,10),
                                               pAVar5 != (AMQP_VALUE)0x0)) {
                                              AVar2 = amqpvalue_get_type(pAVar5);
                                              if ((AVar2 != AMQP_TYPE_NULL) &&
                                                 (iVar3 = amqpvalue_get_map(pAVar5,(AMQP_VALUE *)
                                                                                   &next_incoming_id
                                                                           ), iVar3 != 0)) {
                                                amqpvalue_destroy(pAVar5);
                                                flow_destroy(*flow_handle);
                                                return 0x16d2;
                                              }
                                              amqpvalue_destroy(pAVar5);
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                                pAVar5 = amqpvalue_clone(value);
                                pFVar4->composite_value = pAVar5;
                                iVar3 = 0;
                              }
                              else {
                                amqpvalue_destroy(pAVar6);
                                flow_destroy(*flow_handle);
                                iVar3 = 0x1602;
                              }
                            }
                          }
                        }
                      }
                      else {
                        amqpvalue_destroy(pAVar6);
                        flow_destroy(*flow_handle);
                        iVar3 = 0x15d9;
                      }
                    }
                  }
                }
              }
              else {
                amqpvalue_destroy(pAVar6);
                flow_destroy(*flow_handle);
                iVar3 = 0x15b0;
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int amqpvalue_get_flow(AMQP_VALUE value, FLOW_HANDLE* flow_handle)
{
    int result;
    FLOW_INSTANCE* flow_instance = (FLOW_INSTANCE*)flow_create_internal();
    *flow_handle = flow_instance;
    if (*flow_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            flow_destroy(*flow_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* next-incoming-id */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                transfer_number next_incoming_id;
                                if (amqpvalue_get_transfer_number(item_value, &next_incoming_id) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    flow_destroy(*flow_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* incoming-window */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            {
                                flow_destroy(*flow_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                flow_destroy(*flow_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                uint32_t incoming_window;
                                if (amqpvalue_get_uint(item_value, &incoming_window) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    flow_destroy(*flow_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* next-outgoing-id */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            {
                                flow_destroy(*flow_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                flow_destroy(*flow_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                transfer_number next_outgoing_id;
                                if (amqpvalue_get_transfer_number(item_value, &next_outgoing_id) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    flow_destroy(*flow_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* outgoing-window */
                    if (list_item_count > 3)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 3);
                        if (item_value == NULL)
                        {
                            {
                                flow_destroy(*flow_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                flow_destroy(*flow_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                uint32_t outgoing_window;
                                if (amqpvalue_get_uint(item_value, &outgoing_window) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    flow_destroy(*flow_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* handle */
                    if (list_item_count > 4)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 4);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                handle handle;
                                if (amqpvalue_get_handle(item_value, &handle) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    flow_destroy(*flow_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* delivery-count */
                    if (list_item_count > 5)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 5);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                sequence_no delivery_count;
                                if (amqpvalue_get_sequence_no(item_value, &delivery_count) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    flow_destroy(*flow_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* link-credit */
                    if (list_item_count > 6)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 6);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                uint32_t link_credit;
                                if (amqpvalue_get_uint(item_value, &link_credit) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    flow_destroy(*flow_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* available */
                    if (list_item_count > 7)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 7);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                uint32_t available;
                                if (amqpvalue_get_uint(item_value, &available) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    flow_destroy(*flow_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* drain */
                    if (list_item_count > 8)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 8);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool drain;
                                if (amqpvalue_get_boolean(item_value, &drain) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    flow_destroy(*flow_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* echo */
                    if (list_item_count > 9)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 9);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool echo;
                                if (amqpvalue_get_boolean(item_value, &echo) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    flow_destroy(*flow_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* properties */
                    if (list_item_count > 10)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 10);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                fields properties;
                                if (amqpvalue_get_fields(item_value, &properties) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    flow_destroy(*flow_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    flow_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}